

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O0

void TestDoubleToExponential(void)

{
  undefined1 uVar1;
  undefined1 uVar2;
  char *file;
  DoubleToStringConverter *this;
  double dVar3;
  DoubleToStringConverter dc4;
  DoubleToStringConverter dc3;
  DoubleToStringConverter dc2;
  double max_double;
  DoubleToStringConverter dc;
  StringBuilder builder;
  int flags;
  char buffer [256];
  int kBufferSize;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffafc;
  undefined4 uVar5;
  int in_stack_fffffffffffffb04;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 uVar6;
  int in_stack_fffffffffffffb0c;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffb14;
  int in_stack_fffffffffffffb1c;
  char *in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  undefined8 in_stack_fffffffffffffba8;
  int iVar8;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  DoubleToStringConverter *in_stack_fffffffffffffbb8;
  DoubleToStringConverter local_200;
  DoubleToStringConverter local_1d0;
  DoubleToStringConverter local_1a0;
  undefined8 local_170;
  DoubleToStringConverter local_158;
  StringBuilder local_128;
  int local_10c;
  undefined4 local_4;
  
  iVar8 = (int)((ulong)in_stack_fffffffffffffba8 >> 0x20);
  local_4 = 0x100;
  local_10c = 9;
  double_conversion::StringBuilder::StringBuilder
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             in_stack_fffffffffffffb04);
  uVar7 = 0;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_158,local_10c,"Infinity","NaN",'e',0,0,0,0,0);
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  local_170 = 0x7fefffffffffffff;
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  local_10c = 0;
  uVar7 = 0;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_1a0,0,"Infinity","NaN",'e',0,0,0,0,0);
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::DoubleToStringConverter::ToExponential
            (in_stack_fffffffffffffbb8,
             (double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  uVar5 = 0;
  uVar4 = 0;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_1d0,local_10c,(char *)0x0,(char *)0x0,'e',0,0,0,0,0);
  double_conversion::StringBuilder::Reset(&local_128);
  this = (DoubleToStringConverter *)double_conversion::Double::Infinity();
  uVar1 = double_conversion::DoubleToStringConverter::ToExponential
                    (this,(double)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                     iVar8,(StringBuilder *)
                           CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar5),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar4),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Reset(&local_128);
  dVar3 = double_conversion::Double::Infinity();
  iVar8 = (int)((ulong)dVar3 >> 0x20);
  uVar2 = double_conversion::DoubleToStringConverter::ToExponential
                    (this,(double)CONCAT17(uVar1,in_stack_fffffffffffffbb0),iVar8,
                     (StringBuilder *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0))
  ;
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar5),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar4),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::Double::NaN();
  double_conversion::DoubleToStringConverter::ToExponential
            (this,(double)CONCAT17(uVar1,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(uVar2,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar5),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar4),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::Double::NaN();
  double_conversion::DoubleToStringConverter::ToExponential
            (this,(double)CONCAT17(uVar1,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(uVar2,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar5),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar4),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  uVar7 = 0;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_200,local_10c,"Infinity","NaN",'e',0,0,0,0,0);
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::Double::Infinity();
  double_conversion::DoubleToStringConverter::ToExponential
            (this,(double)CONCAT17(uVar1,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(uVar2,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::Double::Infinity();
  double_conversion::DoubleToStringConverter::ToExponential
            (this,(double)CONCAT17(uVar1,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(uVar2,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::Double::NaN();
  double_conversion::DoubleToStringConverter::ToExponential
            (this,(double)CONCAT17(uVar1,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(uVar2,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                    (char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),
                    (char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::Reset(&local_128);
  double_conversion::Double::NaN();
  double_conversion::DoubleToStringConverter::ToExponential
            (this,(double)CONCAT17(uVar1,in_stack_fffffffffffffbb0),iVar8,
             (StringBuilder *)CONCAT17(uVar2,in_stack_fffffffffffffba0));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffb14,uVar7),in_stack_fffffffffffffb0c,
              (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
              SUB41((uint)in_stack_fffffffffffffafc >> 0x18,0));
  file = double_conversion::StringBuilder::Finalize
                   ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  CheckEqualsHelper(file,in_stack_fffffffffffffb1c,(char *)CONCAT44(in_stack_fffffffffffffb14,uVar7)
                    ,(char *)CONCAT44(in_stack_fffffffffffffb0c,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffb04,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffafc,uVar4));
  double_conversion::StringBuilder::~StringBuilder
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffb04,uVar5));
  return;
}

Assistant:

TEST(DoubleToExponential) {
  const int kBufferSize = 256;
  char buffer[kBufferSize];
  int flags = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN |
      DoubleToStringConverter::UNIQUE_ZERO;
  StringBuilder builder(buffer, kBufferSize);
  DoubleToStringConverter dc(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc.ToExponential(0.0, 5, &builder));
  CHECK_EQ("0.00000e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.0, 0, &builder));
  CHECK_EQ("0e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.0, 1, &builder));
  CHECK_EQ("0.0e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.123456, 5, &builder));
  CHECK_EQ("1.23456e-1", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(1.2, 1, &builder));
  CHECK_EQ("1.2e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(-0.0, 1, &builder));
  CHECK_EQ("0.0e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.0, 2, &builder));
  CHECK_EQ("0.00e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(-0.0, 2, &builder));
  CHECK_EQ("0.00e+0", builder.Finalize());

  DOUBLE_CONVERSION_ASSERT(DoubleToStringConverter::kMaxExponentialDigits == 120);
  builder.Reset();
  CHECK(dc.ToExponential(
      0.0, DoubleToStringConverter::kMaxExponentialDigits, &builder));
  CHECK_EQ("0.00000000000000000000000000000000000000000000000000000000000"
           "0000000000000000000000000000000000000000000000000000000000000e+0",
           builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(
      9e59, DoubleToStringConverter::kMaxExponentialDigits, &builder));
  CHECK_EQ("8.99999999999999918767229449717619953810131273674690656206848"
           "0000000000000000000000000000000000000000000000000000000000000e+59",
           builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(
      -9e59, DoubleToStringConverter::kMaxExponentialDigits, &builder));
  CHECK_EQ("-8.99999999999999918767229449717619953810131273674690656206848"
           "0000000000000000000000000000000000000000000000000000000000000e+59",
           builder.Finalize());

  const double max_double = 1.7976931348623157e308;
  builder.Reset();
  CHECK(dc.ToExponential(
      max_double, DoubleToStringConverter::kMaxExponentialDigits, &builder));
  CHECK_EQ("1.79769313486231570814527423731704356798070567525844996598917"
           "4768031572607800285387605895586327668781715404589535143824642e+308",
           builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.000001, 2, &builder));
  CHECK_EQ("1.00e-6", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.0000001, 2, &builder));
  CHECK_EQ("1.00e-7", builder.Finalize());

  // Test the examples in the comments of ToExponential.
  flags = DoubleToStringConverter::NO_FLAGS;
  DoubleToStringConverter dc2(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc2.ToExponential(3.12, 1, &builder));
  CHECK_EQ("3.1e0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(5.0, 3, &builder));
  CHECK_EQ("5.000e0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(0.001, 2, &builder));
  CHECK_EQ("1.00e-3", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(3.1415, -1, &builder));
  CHECK_EQ("3.1415e0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(3.1415, 4, &builder));
  CHECK_EQ("3.1415e0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(3.1415, 3, &builder));
  CHECK_EQ("3.142e0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(123456789000000, 3, &builder));
  CHECK_EQ("1.235e14", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(1000000000000000019884624838656.0, -1, &builder));
  CHECK_EQ("1e30", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(1000000000000000019884624838656.0, 32, &builder));
  CHECK_EQ("1.00000000000000001988462483865600e30", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(1234, 0, &builder));
  CHECK_EQ("1e3", builder.Finalize());

  // Test special value handling.
  DoubleToStringConverter dc3(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(!dc3.ToExponential(Double::Infinity(), 1, &builder));

  builder.Reset();
  CHECK(!dc3.ToExponential(-Double::Infinity(), 1, &builder));

  builder.Reset();
  CHECK(!dc3.ToExponential(Double::NaN(), 1, &builder));

  builder.Reset();
  CHECK(!dc3.ToExponential(-Double::NaN(), 1, &builder));

  DoubleToStringConverter dc4(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc4.ToExponential(Double::Infinity(), 1, &builder));
  CHECK_EQ("Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToExponential(-Double::Infinity(), 1, &builder));
  CHECK_EQ("-Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToExponential(Double::NaN(), 1, &builder));
  CHECK_EQ("NaN", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToExponential(-Double::NaN(), 1, &builder));
  CHECK_EQ("NaN", builder.Finalize());
}